

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::clear
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this)

{
  undefined1 local_20 [8];
  vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
  *in_stack_ffffffffffffffe8;
  vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
  *in_stack_fffffffffffffff0;
  
  std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
  clear((vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
         *)0x1c185b);
  memset(local_20,0,0x18);
  std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
  vector((vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
          *)0x1c1876);
  std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
  swap(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
  ~vector(in_stack_fffffffffffffff0);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }